

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void wc_relative_cb(Fl_Light_Button *i,void *v)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Fl_Widget_Class_Type *t;
  Fl_Type *o;
  int mod;
  void *v_local;
  Fl_Light_Button *i_local;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[5])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"widget_class");
    if (iVar3 == 0) {
      (*(i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[5])();
      Fl_Button::value(&i->super_Fl_Button,
                       (int)*(char *)((long)&current_widget[1].super_Fl_Type.prev + 1));
    }
    else {
      (*(i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[6])();
    }
  }
  else {
    bVar1 = false;
    for (t = (Fl_Widget_Class_Type *)Fl_Type::first; t != (Fl_Widget_Class_Type *)0x0;
        t = (Fl_Widget_Class_Type *)
            (t->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.next) {
      if ((t->super_Fl_Window_Type).super_Fl_Widget_Type.super_Fl_Type.selected != '\0') {
        iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[5])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"widget_class");
        if (iVar3 == 0) {
          cVar2 = Fl_Button::value(&i->super_Fl_Button);
          t->wc_relative = cVar2;
          bVar1 = true;
        }
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void wc_relative_cb(Fl_Light_Button *i, void *v) {
  if (v == LOAD) {
    if (!strcmp(current_widget->type_name(), "widget_class")) {
      i->show();
      i->value(((Fl_Widget_Class_Type *)current_widget)->wc_relative);
    } else {
      i->hide();
    }
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && !strcmp(current_widget->type_name(), "widget_class")) {
        Fl_Widget_Class_Type *t = (Fl_Widget_Class_Type *)o;
        t->wc_relative = i->value();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}